

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O1

PBuffer __thiscall DataSourceCustom::get_sound(DataSourceCustom *this,size_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  ConfigFile *this_00;
  pointer pcVar4;
  char cVar5;
  ResInfo *pRVar6;
  long *plVar7;
  size_type *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  PBuffer PVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fpath;
  string file_name;
  stringstream stream;
  undefined1 auStack_238 [8];
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [2];
  undefined8 auStack_190 [12];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  pRVar6 = get_info((DataSourceCustom *)index,AssetSound);
  if (pRVar6 == (ResInfo *)0x0) {
    (this->super_DataSourceBase).super_Source._vptr_Source = (_func_int **)0x0;
    (this->super_DataSourceBase).path._M_dataplus._M_p = (pointer)0x0;
    _Var9._M_pi = extraout_RDX;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    lVar3 = *(long *)(local_1a0[0] + -0x18);
    if (acStack_c0[lVar3 + 1] == '\0') {
      cVar5 = std::ios::widen((char)auStack_238 + (char)lVar3 + -0x68);
      acStack_c0[lVar3] = cVar5;
      acStack_c0[lVar3 + 1] = '\x01';
    }
    acStack_c0[lVar3] = '0';
    *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    this_00 = (pRVar6->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::stringbuf::str();
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"path","");
    std::__cxx11::stringbuf::str();
    ConfigFile::value(&local_1f0,this_00,&local_210,&local_230,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (pRVar6->path)._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar4,pcVar4 + (pRVar6->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_230);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_230,(ulong)local_1f0._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_210.field_2._M_allocated_capacity = *psVar8;
      local_210.field_2._8_8_ = plVar7[3];
      local_210._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar8;
      local_210._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_210._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    (this->super_DataSourceBase).super_Source._vptr_Source = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Buffer,std::allocator<Buffer>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_DataSourceBase).path,
               (Buffer **)this,(allocator<Buffer> *)&local_230,&local_210);
    std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Buffer,Buffer>
              ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)this,
               (Buffer *)(this->super_DataSourceBase).super_Source._vptr_Source);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    _Var9._M_pi = extraout_RDX_00;
  }
  PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
  PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar10.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceCustom::get_sound(size_t index) {
  ResInfo *info = get_info(Data::AssetSound);
  if (info == nullptr) {
    return nullptr;
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string file_name = info->meta->value(stream.str(), "path", stream.str());
  std::string fpath = info->path + "/" + file_name;

  try {
    PBuffer file = std::make_shared<Buffer>(fpath);
    return file;
  } catch (...) {
    return nullptr;
  }
}